

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

void __thiscall glslang::TInputScanner::setString(TInputScanner *this,int newString)

{
  TSourceLoc *pTVar1;
  int iVar2;
  int newString_local;
  TInputScanner *this_local;
  
  (this->logicalSourceLoc).string = newString;
  pTVar1 = this->loc;
  iVar2 = getLastValidSourceIndex(this);
  pTVar1[iVar2].string = newString;
  (this->logicalSourceLoc).name = (TString *)0x0;
  pTVar1 = this->loc;
  iVar2 = getLastValidSourceIndex(this);
  pTVar1[iVar2].name = (TString *)0x0;
  return;
}

Assistant:

void setString(int newString)
    {
        logicalSourceLoc.string = newString;
        loc[getLastValidSourceIndex()].string = newString;
        logicalSourceLoc.name = nullptr;
        loc[getLastValidSourceIndex()].name = nullptr;
    }